

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O1

void QCoreApplicationPrivate::sendPostedEvents(QObject *receiver,int event_type,QThreadData *data)

{
  int *piVar1;
  QAtomicInt *pQVar2;
  qsizetype *pqVar3;
  QEvent *pQVar4;
  QObject *receiver_00;
  QThreadData *pQVar5;
  int iVar6;
  long lVar7;
  iterator abegin;
  uint uVar8;
  int iVar9;
  long lVar10;
  QPostEvent *pQVar11;
  long lVar12;
  long in_FS_OFFSET;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  QPostEvent local_88;
  QObject *local_68;
  uint uStack_60;
  undefined4 uStack_5c;
  QThreadData *local_58;
  long lStack_50;
  unique_lock<QMutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = 0;
  if (event_type != -1) {
    uVar8 = event_type;
  }
  if ((receiver == (QObject *)0x0) || ((QThreadData *)(receiver->d_ptr).d[1].q_ptr == data)) {
    piVar1 = &(data->postEventList).recursion;
    *piVar1 = *piVar1 + 1;
    local_48._M_device = &(data->postEventList).mutex;
    local_48._M_owns = false;
    local_48._9_7_ = 0xaaaaaaaaaaaaaa;
    std::unique_lock<QMutex>::lock(&local_48);
    local_48._M_owns = true;
    bVar13 = (data->postEventList).super_QList<QPostEvent>.d.size == 0;
    data->canWait = bVar13;
    if ((bVar13) ||
       ((receiver != (QObject *)0x0 &&
        ((((receiver->d_ptr).d)->postedEvents).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0)))) {
      piVar1 = &(data->postEventList).recursion;
      *piVar1 = *piVar1 + -1;
    }
    else {
      bVar13 = receiver == (QObject *)0x0;
      data->canWait = true;
      bVar14 = uVar8 == 0;
      (data->postEventList).insertionOffset = (data->postEventList).super_QList<QPostEvent>.d.size;
      _uStack_60 = CONCAT44(0xaaaaaaaa,uVar8);
      lStack_50._0_1_ = 1;
      lStack_50._1_7_ = 0xaaaaaaaaaaaaaa;
      lVar12 = (data->postEventList).startOffset;
      local_68 = receiver;
      local_58 = data;
LAB_0027916b:
      pQVar5 = local_58;
      lVar7 = lVar12;
      if (bVar14 && bVar13) {
        lVar7 = (data->postEventList).startOffset;
      }
      if (lVar7 < (data->postEventList).super_QList<QPostEvent>.d.size) {
        lVar7 = lVar12;
        if (bVar14 && bVar13) {
          lVar7 = (data->postEventList).startOffset;
        }
        if ((data->postEventList).insertionOffset <= lVar7) goto LAB_00279309;
        lVar10 = lVar12;
        if (bVar14 && bVar13) {
          lVar10 = (data->postEventList).startOffset;
        }
        lVar10 = lVar10 + 1;
        if (bVar14 && bVar13) {
          (data->postEventList).startOffset = lVar10;
          lVar10 = lVar12;
        }
        pQVar11 = (data->postEventList).super_QList<QPostEvent>.d.ptr + lVar7;
        pQVar4 = pQVar11->event;
        lVar12 = lVar10;
        if (pQVar4 != (QEvent *)0x0) {
          if (((receiver == (QObject *)0x0) || (pQVar11->receiver == receiver)) &&
             ((uVar8 == 0 || (uVar8 == pQVar4->t)))) {
            if (pQVar4->t == 0x34) {
              iVar6 = *(int *)((long)&pQVar4[1]._vptr_QEvent + 4) + *(int *)&pQVar4[1]._vptr_QEvent;
              iVar9 = data->scopeLevel + data->loopLevel;
              bVar15 = true;
              if ((iVar6 <= iVar9) && (*(int *)&pQVar4[1]._vptr_QEvent != 0 || data->loopLevel < 1))
              {
                bVar15 = iVar6 == iVar9 && uVar8 == 0x34;
              }
              if (!bVar15) {
                if (bVar14 && bVar13) {
                  local_88.receiver = pQVar11->receiver;
                  local_88.event = pQVar11->event;
                  local_88.priority = pQVar11->priority;
                  local_88._20_4_ = *(undefined4 *)&pQVar11->field_0x14;
                  pQVar11->event = (QEvent *)0x0;
                  QPostEventList::addEvent(&data->postEventList,&local_88);
                }
                goto LAB_0027916b;
              }
            }
            pQVar4 = pQVar11->event;
            pQVar4->m_posted = false;
            receiver_00 = pQVar11->receiver;
            LOCK();
            pQVar2 = &((receiver_00->d_ptr).d)->postedEvents;
            (pQVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i =
                 (pQVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            pQVar11->event = (QEvent *)0x0;
            std::unique_lock<QMutex>::unlock(&local_48);
            local_88.event = (QEvent *)0xaaaaaaaaaaaaaa01;
            pQVar4->m_spont = false;
            local_88.receiver = (QObject *)&local_48;
            QCoreApplication::notifyInternal2(receiver_00,pQVar4);
            if (pQVar4 != (QEvent *)0x0) {
              (*pQVar4->_vptr_QEvent[1])(pQVar4);
            }
            std::unique_lock<QMutex>::lock((unique_lock<QMutex> *)local_88.receiver);
            goto LAB_0027916b;
          }
          data->canWait = false;
        }
        goto LAB_0027916b;
      }
LAB_00279309:
      lStack_50 = (ulong)lStack_50._1_7_ << 8;
      piVar1 = &(local_58->postEventList).recursion;
      *piVar1 = *piVar1 + -1;
      if (((*piVar1 == 0) && (local_58->canWait == false)) &&
         ((local_58->eventDispatcher).super_QBasicAtomicPointer<QAbstractEventDispatcher>._q_value.
          _M_b._M_p != (__pointer_type)0x0)) {
        (*(((local_58->eventDispatcher).super_QBasicAtomicPointer<QAbstractEventDispatcher>._q_value
            ._M_b._M_p)->super_QObject)._vptr_QObject[0x14])();
      }
      if (((uStack_60 == 0) && (local_68 == (QObject *)0x0)) &&
         (-1 < (pQVar5->postEventList).startOffset)) {
        abegin = QList<QPostEvent>::begin(&(pQVar5->postEventList).super_QList<QPostEvent>);
        QList<QPostEvent>::erase
                  (&(pQVar5->postEventList).super_QList<QPostEvent>,(const_iterator)abegin.i,
                   abegin.i + (pQVar5->postEventList).startOffset);
        pqVar3 = &(pQVar5->postEventList).insertionOffset;
        *pqVar3 = *pqVar3 - (pQVar5->postEventList).startOffset;
        (pQVar5->postEventList).startOffset = 0;
      }
    }
    std::unique_lock<QMutex>::~unique_lock(&local_48);
  }
  else {
    sendPostedEvents();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCoreApplicationPrivate::sendPostedEvents(QObject *receiver, int event_type,
                                               QThreadData *data)
{
    if (event_type == -1) {
        // we were called by an obsolete event dispatcher.
        event_type = 0;
    }

    if (receiver && receiver->d_func()->threadData.loadRelaxed() != data) {
        qWarning("QCoreApplication::sendPostedEvents: Cannot send "
                 "posted events for objects in another thread");
        return;
    }

    ++data->postEventList.recursion;

    auto locker = qt_unique_lock(data->postEventList.mutex);

    // by default, we assume that the event dispatcher can go to sleep after
    // processing all events. if any new events are posted while we send
    // events, canWait will be set to false.
    data->canWait = (data->postEventList.size() == 0);

    if (data->postEventList.size() == 0
            || (receiver && !receiver->d_func()->postedEvents.loadAcquire())) {
        --data->postEventList.recursion;
        return;
    }

    data->canWait = true;

    // okay. here is the tricky loop. be careful about optimizing
    // this, it looks the way it does for good reasons.
    qsizetype startOffset = data->postEventList.startOffset;
    qsizetype &i = (!event_type && !receiver) ? data->postEventList.startOffset : startOffset;
    data->postEventList.insertionOffset = data->postEventList.size();

    // Exception-safe cleaning up without the need for a try/catch block
    struct CleanUp {
        Q_DISABLE_COPY_MOVE(CleanUp)

        QObject *receiver;
        int event_type;
        QThreadData *data;
        bool exceptionCaught;

        inline CleanUp(QObject *receiver, int event_type, QThreadData *data) :
            receiver(receiver), event_type(event_type), data(data), exceptionCaught(true)
        {}
        inline ~CleanUp()
        {
            if (exceptionCaught) {
                // since we were interrupted, we need another pass to make sure we clean everything up
                data->canWait = false;
            }

            --data->postEventList.recursion;
            if (!data->postEventList.recursion && !data->canWait && data->hasEventDispatcher())
                data->eventDispatcher.loadRelaxed()->wakeUp();

            // clear the global list, i.e. remove everything that was
            // delivered.
            if (!event_type && !receiver && data->postEventList.startOffset >= 0) {
                const QPostEventList::iterator it = data->postEventList.begin();
                data->postEventList.erase(it, it + data->postEventList.startOffset);
                data->postEventList.insertionOffset -= data->postEventList.startOffset;
                Q_ASSERT(data->postEventList.insertionOffset >= 0);
                data->postEventList.startOffset = 0;
            }
        }
    };
    CleanUp cleanup(receiver, event_type, data);

    while (i < data->postEventList.size()) {
        // avoid live-lock
        if (i >= data->postEventList.insertionOffset)
            break;

        const QPostEvent &pe = data->postEventList.at(i);
        ++i;

        if (!pe.event)
            continue;
        if ((receiver && receiver != pe.receiver) || (event_type && event_type != pe.event->type())) {
            data->canWait = false;
            continue;
        }

        if (pe.event->type() == QEvent::DeferredDelete) {
            // DeferredDelete events are sent either
            // 1) when the event loop that posted the event has returned; or
            // 2) if explicitly requested (with QEvent::DeferredDelete) for
            //    events posted by the current event loop; or
            // 3) if the event was posted before the outermost event loop.

            const int eventLoopLevel = static_cast<QDeferredDeleteEvent *>(pe.event)->loopLevel();
            const int eventScopeLevel = static_cast<QDeferredDeleteEvent *>(pe.event)->scopeLevel();

            const bool postedBeforeOutermostLoop = eventLoopLevel == 0;
            const bool allowDeferredDelete =
                (eventLoopLevel + eventScopeLevel > data->loopLevel + data->scopeLevel
                 || (postedBeforeOutermostLoop && data->loopLevel > 0)
                 || (event_type == QEvent::DeferredDelete
                     && eventLoopLevel + eventScopeLevel == data->loopLevel + data->scopeLevel));
            if (!allowDeferredDelete) {
                // cannot send deferred delete
                if (!event_type && !receiver) {
                    // we must copy it first; we want to re-post the event
                    // with the event pointer intact, but we can't delay
                    // nulling the event ptr until after re-posting, as
                    // addEvent may invalidate pe.
                    QPostEvent pe_copy = pe;

                    // null out the event so if sendPostedEvents recurses, it
                    // will ignore this one, as it's been re-posted.
                    const_cast<QPostEvent &>(pe).event = nullptr;

                    // re-post the copied event so it isn't lost
                    data->postEventList.addEvent(pe_copy);
                }
                continue;
            }
        }

        // first, we diddle the event so that we can deliver
        // it, and that no one will try to touch it later.
        pe.event->m_posted = false;
        QEvent *e = pe.event;
        QObject * r = pe.receiver;

        r->d_func()->postedEvents.fetchAndSubAcquire(1);
        Q_ASSERT(r->d_func()->postedEvents >= 0);

        // next, update the data structure so that we're ready
        // for the next event.
        const_cast<QPostEvent &>(pe).event = nullptr;

        locker.unlock();
        const auto relocker = qScopeGuard([&locker] { locker.lock(); });

        const std::unique_ptr<QEvent> event_deleter(e); // will delete the event (with the mutex unlocked)

        // after all that work, it's time to deliver the event.
        QCoreApplication::sendEvent(r, e);

        // careful when adding anything below this point - the
        // sendEvent() call might invalidate any invariants this
        // function depends on.
    }

    cleanup.exceptionCaught = false;
}